

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
asl::Array<asl::Array<asl::Var>_>::Array
          (Array<asl::Array<asl::Var>_> *this,Array<asl::Var> *p,int n)

{
  int *piVar1;
  anon_union_8_8_7df20137_for_Var_3 *paVar2;
  long lVar3;
  Var *pVVar4;
  void *__ptr;
  long lVar5;
  Array<asl::Var> *this_00;
  
  __ptr = (void *)(ulong)(uint)n;
  alloc(this,n);
  if (0 < n) {
    lVar5 = 0;
    do {
      lVar3 = *(long *)((long)&this->_a->_a + lVar5);
      if (lVar3 != *(long *)((long)&p->_a + lVar5)) {
        this_00 = (Array<asl::Var> *)((long)&this->_a->_a + lVar5);
        LOCK();
        piVar1 = (int *)(lVar3 + -8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          Array<asl::Var>::free(this_00,__ptr);
        }
        pVVar4 = *(Var **)((long)&p->_a + lVar5);
        this_00->_a = pVVar4;
        LOCK();
        paVar2 = &pVVar4[-1].field_1;
        paVar2->_i = paVar2->_i + 1;
        UNLOCK();
      }
      lVar5 = lVar5 + 8;
    } while ((ulong)(uint)n << 3 != lVar5);
  }
  return;
}

Assistant:

ASL_EXPLICIT Array(const T* p, int n) { alloc(n); for (int i = 0; i < n; i++) _a[i] = p[i]; }